

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

QString * QFileDialog::getExistingDirectory
                    (QWidget *parent,QString *caption,QString *dir,Options options)

{
  ulong uVar1;
  QString *in_RCX;
  QWidget *in_RDX;
  QArrayDataPointer<char16_t> *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  char16_t *str;
  QUrl selectedUrl;
  QStringList schemes;
  DataPointer *in_stack_ffffffffffffff28;
  QArrayDataPointer<char16_t> *this;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  QWidget *parent_00;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_70;
  undefined4 local_6c;
  QUrl local_68;
  QUrl local_60;
  QArrayDataPointer<char16_t> local_58 [2];
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined4 local_c;
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  local_c = in_R8D;
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_58,(Data *)0x0,L"file",4);
  QString::QString((QString *)this,in_stack_ffffffffffffff28);
  QList<QString>::QList<QString,void>((QList<QString> *)this,(QString *)in_stack_ffffffffffffff28);
  QString::~QString((QString *)0x75af47);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this);
  local_60.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  parent_00 = in_RDX;
  QUrl::fromLocalFile((QString *)&local_68);
  local_6c = local_c;
  getExistingDirectoryUrl
            (parent_00,in_RCX,(QUrl *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (QFlagsStorageHelper<QFileDialog::Option,_4>)SUB84((ulong)lVar2 >> 0x20,0),
             (QStringList *)in_RDX);
  QUrl::~QUrl(&local_68);
  uVar1 = QUrl::isLocalFile();
  if ((uVar1 & 1) == 0) {
    uVar1 = QUrl::isEmpty();
    if ((uVar1 & 1) == 0) {
      QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
                (&local_70,PrettyDecoded);
      QUrl::toString((QUrlTwoFlags_conflict *)this);
      goto LAB_0075b01c;
    }
  }
  QUrl::toLocalFile();
LAB_0075b01c:
  QUrl::~QUrl(&local_60);
  QList<QString>::~QList((QList<QString> *)0x75b033);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileDialog::getExistingDirectory(QWidget *parent,
                                          const QString &caption,
                                          const QString &dir,
                                          Options options)
{
    const QStringList schemes = QStringList(QStringLiteral("file"));
    const QUrl selectedUrl =
            getExistingDirectoryUrl(parent, caption, QUrl::fromLocalFile(dir), options, schemes);
    if (selectedUrl.isLocalFile() || selectedUrl.isEmpty())
        return selectedUrl.toLocalFile();
    else
        return selectedUrl.toString();
}